

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<long>::Add(RepeatedField<long> *this,long *value)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  long tmp;
  uint32_t size;
  long *value_local;
  RepeatedField<long> *this_local;
  
  uVar1 = this->current_size_;
  if (uVar1 == this->total_size_) {
    lVar2 = *value;
    Reserve(this,this->total_size_ + 1);
    plVar3 = elements(this);
    plVar3[uVar1] = lVar2;
  }
  else {
    lVar2 = *value;
    plVar3 = elements(this);
    plVar3[uVar1] = lVar2;
  }
  this->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32_t size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}